

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O0

boolean output_pass_setup(j_decompress_ptr cinfo)

{
  int iVar1;
  undefined4 uVar2;
  long in_RDI;
  JDIMENSION last_scanline;
  
  if (*(int *)(in_RDI + 0x24) != 0xcc) {
    (*(code *)**(undefined8 **)(in_RDI + 0x220))(in_RDI);
    *(undefined4 *)(in_RDI + 0xa8) = 0;
    *(undefined4 *)(in_RDI + 0x24) = 0xcc;
  }
  do {
    if (*(int *)(*(long *)(in_RDI + 0x220) + 0x10) == 0) {
      uVar2 = 0xcd;
      if (*(int *)(in_RDI + 0x5c) != 0) {
        uVar2 = 0xce;
      }
      *(undefined4 *)(in_RDI + 0x24) = uVar2;
      return 1;
    }
    while (*(uint *)(in_RDI + 0xa8) < *(uint *)(in_RDI + 0x8c)) {
      if (*(long *)(in_RDI + 0x10) != 0) {
        *(ulong *)(*(long *)(in_RDI + 0x10) + 8) = (ulong)*(uint *)(in_RDI + 0xa8);
        *(ulong *)(*(long *)(in_RDI + 0x10) + 0x10) = (ulong)*(uint *)(in_RDI + 0x8c);
        (*(code *)**(undefined8 **)(in_RDI + 0x10))(in_RDI);
      }
      iVar1 = *(int *)(in_RDI + 0xa8);
      (**(code **)(*(long *)(in_RDI + 0x228) + 8))(in_RDI,0,in_RDI + 0xa8,0);
      if (*(int *)(in_RDI + 0xa8) == iVar1) {
        return 0;
      }
    }
    (**(code **)(*(long *)(in_RDI + 0x220) + 8))(in_RDI);
    (*(code *)**(undefined8 **)(in_RDI + 0x220))(in_RDI);
    *(undefined4 *)(in_RDI + 0xa8) = 0;
  } while( true );
}

Assistant:

LOCAL(boolean)
output_pass_setup(j_decompress_ptr cinfo)
{
  if (cinfo->global_state != DSTATE_PRESCAN) {
    /* First call: do pass setup */
    (*cinfo->master->prepare_for_output_pass) (cinfo);
    cinfo->output_scanline = 0;
    cinfo->global_state = DSTATE_PRESCAN;
  }
  /* Loop over any required dummy passes */
  while (cinfo->master->is_dummy_pass) {
#ifdef QUANT_2PASS_SUPPORTED
    /* Crank through the dummy pass */
    while (cinfo->output_scanline < cinfo->output_height) {
      JDIMENSION last_scanline;
      /* Call progress monitor hook if present */
      if (cinfo->progress != NULL) {
        cinfo->progress->pass_counter = (long)cinfo->output_scanline;
        cinfo->progress->pass_limit = (long)cinfo->output_height;
        (*cinfo->progress->progress_monitor) ((j_common_ptr)cinfo);
      }
      /* Process some data */
      last_scanline = cinfo->output_scanline;
      (*cinfo->main->process_data) (cinfo, (JSAMPARRAY)NULL,
                                    &cinfo->output_scanline, (JDIMENSION)0);
      if (cinfo->output_scanline == last_scanline)
        return FALSE;           /* No progress made, must suspend */
    }
    /* Finish up dummy pass, and set up for another one */
    (*cinfo->master->finish_output_pass) (cinfo);
    (*cinfo->master->prepare_for_output_pass) (cinfo);
    cinfo->output_scanline = 0;
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif /* QUANT_2PASS_SUPPORTED */
  }
  /* Ready for application to drive output pass through
   * jpeg_read_scanlines or jpeg_read_raw_data.
   */
  cinfo->global_state = cinfo->raw_data_out ? DSTATE_RAW_OK : DSTATE_SCANNING;
  return TRUE;
}